

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> * __thiscall
ggml_backend_cpu_get_features::anon_class_1_0_00000001::operator()
          (vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>
           *__return_storage_ptr__,anon_class_1_0_00000001 *this)

{
  pointer pgVar1;
  _Alloc_hider _Var2;
  int iVar3;
  vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *pvVar4;
  vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *extraout_RAX;
  vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *extraout_RAX_00;
  ggml_backend_feature local_18;
  
  ggml_cpu_init();
  features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = ggml_cpu_has_sse3();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "SSE3";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "SSE3";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_ssse3();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "SSSE3";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "SSSE3";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx_vnni();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX_VNNI";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX_VNNI";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx2();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX2";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX2";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_f16c();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "F16C";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "F16C";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_fma();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "FMA";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "FMA";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_bmi2();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "BMI2";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "BMI2";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx512();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX512";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX512";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx512_vbmi();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX512_VBMI";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX512_VBMI";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx512_vnni();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX512_VNNI";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX512_VNNI";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_avx512_bf16();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AVX512_BF16";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AVX512_BF16";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_amx_int8();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "AMX_INT8";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "AMX_INT8";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_neon();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "NEON";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "NEON";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_arm_fma();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "ARM_FMA";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "ARM_FMA";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_fp16_va();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "FP16_VA";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "FP16_VA";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_matmul_int8();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "MATMUL_INT8";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "MATMUL_INT8";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_sve();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "SVE";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "SVE";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_dotprod();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "DOTPROD";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "DOTPROD";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_get_sve_cnt();
  if (0 < iVar3) {
    if (ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::sve_cnt_abi_cxx11_ ==
        '\0') {
      iVar3 = __cxa_guard_acquire(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::
                                   operator()()::sve_cnt_abi_cxx11_);
      if (iVar3 != 0) {
        iVar3 = ggml_cpu_get_sve_cnt();
        std::__cxx11::to_string
                  (&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                    sve_cnt_abi_cxx11_,iVar3);
        __cxa_atexit(std::__cxx11::string::~string,
                     &ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                      sve_cnt_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                             sve_cnt_abi_cxx11_);
      }
    }
    _Var2._M_p = ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::
                 sve_cnt_abi_cxx11_._M_dataplus._M_p;
    pgVar1 = features.
             super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl
             .super__Vector_impl_data._M_finish;
    local_18.name = "SVE_CNT";
    local_18.value =
         ggml_backend_cpu_get_features(ggml_backend_reg*)::$_0::operator()()::sve_cnt_abi_cxx11_.
         _M_dataplus._M_p;
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "SVE_CNT";
      pgVar1->value = _Var2._M_p;
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_sme();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "SME";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "SME";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_riscv_v();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "RISCV_V";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "RISCV_V";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_vsx();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "VSX";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "VSX";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_vxe();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "VXE";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "VXE";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_wasm_simd();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "WASM_SIMD";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "WASM_SIMD";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  iVar3 = ggml_cpu_has_llamafile();
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (iVar3 != 0) {
    local_18.name = "LLAMAFILE";
    local_18.value = "1";
    if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
      _M_realloc_insert<ggml_backend_feature>
                (&features,
                 (iterator)
                 features.
                 super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
                 _M_impl.super__Vector_impl_data._M_finish,&local_18);
    }
    else {
      (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
       _M_impl.super__Vector_impl_data._M_finish)->name = "LLAMAFILE";
      pgVar1->value = "1";
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_18.name = "AARCH64_REPACK";
  pvVar4 = (vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_> *)0x1765cb;
  local_18.value = "1";
  if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
    _M_realloc_insert<ggml_backend_feature>
              (&features,
               (iterator)
               features.
               super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_18);
    pvVar4 = extraout_RAX;
  }
  else {
    (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
     _M_impl.super__Vector_impl_data._M_finish)->name = "AARCH64_REPACK";
    pgVar1->value = "1";
    features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl
    .super__Vector_impl_data._M_finish =
         features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  pgVar1 = features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_18.name = (char *)0x0;
  local_18.value = (char *)0x0;
  if (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>::
    _M_realloc_insert<ggml_backend_feature>
              (&features,
               (iterator)
               features.
               super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_18);
    pvVar4 = extraout_RAX_00;
  }
  else {
    (features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
     _M_impl.super__Vector_impl_data._M_finish)->name = (char *)0x0;
    pgVar1->value = (char *)0x0;
    features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>._M_impl
    .super__Vector_impl_data._M_finish =
         features.super__Vector_base<ggml_backend_feature,_std::allocator<ggml_backend_feature>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  return pvVar4;
}

Assistant:

static ggml_backend_feature * ggml_backend_cpu_get_features(ggml_backend_reg_t reg) {
    static std::vector<ggml_backend_feature> features = []() {
        ggml_cpu_init();

        std::vector<ggml_backend_feature> features;
        if (ggml_cpu_has_sse3()) {
            features.push_back({ "SSE3", "1" });
        }
        if (ggml_cpu_has_ssse3()) {
            features.push_back({ "SSSE3", "1" });
        }
        if (ggml_cpu_has_avx()) {
            features.push_back({ "AVX", "1" });
        }
        if (ggml_cpu_has_avx_vnni()) {
            features.push_back({ "AVX_VNNI", "1" });
        }
        if (ggml_cpu_has_avx2()) {
            features.push_back({ "AVX2", "1" });
        }
        if (ggml_cpu_has_f16c()) {
            features.push_back({ "F16C", "1" });
        }
        if (ggml_cpu_has_fma()) {
            features.push_back({ "FMA", "1" });
        }
        if (ggml_cpu_has_bmi2()) {
            features.push_back({ "BMI2", "1" });
        }
        if (ggml_cpu_has_avx512()) {
            features.push_back({ "AVX512", "1" });
        }
        if (ggml_cpu_has_avx512_vbmi()) {
            features.push_back({ "AVX512_VBMI", "1" });
        }
        if (ggml_cpu_has_avx512_vnni()) {
            features.push_back({ "AVX512_VNNI", "1" });
        }
        if (ggml_cpu_has_avx512_bf16()) {
            features.push_back({ "AVX512_BF16", "1" });
        }
        if (ggml_cpu_has_amx_int8()) {
            features.push_back({ "AMX_INT8", "1" });
        }
        if (ggml_cpu_has_neon()) {
            features.push_back({ "NEON", "1" });
        }
        if (ggml_cpu_has_arm_fma()) {
            features.push_back({ "ARM_FMA", "1" });
        }
        if (ggml_cpu_has_fp16_va()) {
            features.push_back({ "FP16_VA", "1" });
        }
        if (ggml_cpu_has_matmul_int8()) {
            features.push_back({ "MATMUL_INT8", "1" });
        }
        if (ggml_cpu_has_sve()) {
            features.push_back({ "SVE", "1" });
        }
        if (ggml_cpu_has_dotprod()) {
            features.push_back({ "DOTPROD", "1" });
        }
        if (ggml_cpu_get_sve_cnt() > 0) {
            static std::string sve_cnt = std::to_string(ggml_cpu_get_sve_cnt());
            features.push_back({ "SVE_CNT", sve_cnt.c_str() });
        }
        if (ggml_cpu_has_sme()) {
            features.push_back({ "SME", "1" });
        }
        if (ggml_cpu_has_riscv_v()) {
            features.push_back({ "RISCV_V", "1" });
        }
        if (ggml_cpu_has_vsx()) {
            features.push_back({ "VSX", "1" });
        }
        if (ggml_cpu_has_vxe()) {
            features.push_back({ "VXE", "1" });
        }
        if (ggml_cpu_has_wasm_simd()) {
            features.push_back({ "WASM_SIMD", "1" });
        }
        if (ggml_cpu_has_llamafile()) {
            features.push_back({ "LLAMAFILE", "1" });
        }
    #ifdef GGML_USE_ACCELERATE
        features.push_back({ "ACCELERATE", "1" });
    #endif
    #ifdef GGML_USE_CPU_HBM
        features.push_back({ "CPU_HBM", "1" });
    #endif
    #ifdef GGML_USE_OPENMP
        features.push_back({ "OPENMP", "1" });
    #endif
    #ifdef GGML_USE_CPU_KLEIDIAI
        features.push_back({ "KLEIDIAI", "1" });
    #endif
    #ifdef GGML_USE_CPU_AARCH64
        features.push_back({ "AARCH64_REPACK", "1" });
    #endif

        features.push_back({ nullptr, nullptr });

        return features;
    }();

    return features.data();

    GGML_UNUSED(reg);
}